

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

bool __thiscall QBlitterPaintEngine::begin(QBlitterPaintEngine *this,QPaintDevice *pdev)

{
  QPaintEnginePrivate *pQVar1;
  bool bVar2;
  
  pQVar1 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  bVar2 = QRasterPaintEngine::begin(&this->super_QRasterPaintEngine,pdev);
  pQVar1->pdev = pdev;
  return bVar2;
}

Assistant:

bool QBlitterPaintEngine::begin(QPaintDevice *pdev)
{
    Q_D(QBlitterPaintEngine);
    bool ok = QRasterPaintEngine::begin(pdev);
#ifdef QT_BLITTER_RASTEROVERLAY
    d->pmData->unmergeOverlay();
#endif
    d->pdev = pdev;
    return ok;
}